

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestSetUp.h
# Opt level: O0

void __thiscall CppUnit::TestSetUp::~TestSetUp(TestSetUp *this)

{
  TestSetUp *this_local;
  
  ~TestSetUp(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

class CPPUNIT_API TestSetUp : public TestDecorator 
{
public:
  TestSetUp( Test *test );

  void run( TestResult *result );

protected:
  virtual void setUp();
  virtual void tearDown();

private:
  TestSetUp( const TestSetUp & );
  void operator =( const TestSetUp & );
}